

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

vm_obj_id_t CVmObjBigNum::create_radix(int in_root_set,char *str,size_t len,int radix)

{
  int iVar1;
  vm_obj_id_t obj_id;
  CVmObjBigNum *this;
  
  iVar1 = precision_from_string(str,len,radix);
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,in_root_set,0,0);
  this = (CVmObjBigNum *)CVmObject::operator_new(0x10,obj_id);
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_0034a6b0;
  alloc_bignum(this,(long)iVar1);
  if (radix == 10) {
    parse_str_into((this->super_CVmObject).ext_,str,len);
  }
  else {
    parse_str_into(*(char **)((long)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].ptr_ + 8),
                   str,len,radix);
  }
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjBigNum::create_radix(
    VMG_ int in_root_set, const char *str, size_t len, int radix)
{
    int digits = precision_from_string(str, len, radix);
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);
    if (radix == 10)
        new (vmg_ id) CVmObjBigNum(vmg_ str, len, digits);
    else
    {
        new (vmg_ id) CVmObjBigNum(vmg_ digits);
        ((CVmObjBigNum *)vm_objp(vmg_ id))->set_str_val(str, len, radix);
    }
    return id;
}